

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::iterate(SparseTextureClampLookupColorTestCase *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ContextInfo *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ulong uVar5;
  reference pFVar6;
  long lVar7;
  ostream *poVar8;
  TestLog *this_01;
  MessageBuilder *pMVar9;
  byte local_322;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  MessageBuilder local_2b8;
  int local_134;
  int local_130;
  int maxLevels;
  int l;
  byte local_101;
  int local_100;
  bool isSparse;
  undefined1 local_f0 [8];
  FunctionToken funcToken;
  __normal_iterator<gl4cts::SparseTexture2LookupTestCase::FunctionToken_*,_std::vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>_>
  local_78;
  __normal_iterator<const_gl4cts::SparseTexture2LookupTestCase::FunctionToken_*,_std::vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>_>
  local_70;
  const_iterator tokIter;
  GLint *format;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  const_iterator formIter;
  GLint *target;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator iter;
  GLuint texture;
  bool result;
  Functions *gl;
  SparseTextureClampLookupColorTestCase *this_local;
  Functions *gl_00;
  
  this_00 = deqp::Context::getContextInfo
                      ((this->super_SparseTextureClampLookupResidencyTestCase).
                       super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                       super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_sparse_texture_clamp");
  if (bVar1) {
    pRVar4 = deqp::Context::getRenderContext
                       ((this->super_SparseTextureClampLookupResidencyTestCase).
                        super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                        super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
    iVar3 = (*pRVar4->_vptr_RenderContext[3])();
    gl_00 = (Functions *)CONCAT44(extraout_var,iVar3);
    iter._M_current._7_1_ = 1;
    local_38._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          (&(this->super_SparseTextureClampLookupResidencyTestCase).
                            super_SparseTexture2LookupTestCase.
                            super_SparseTexture2CommitmentTestCase.
                            super_SparseTextureCommitmentTestCase.mSupportedTargets);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_30,
               &local_38);
    while( true ) {
      target = (GLint *)std::vector<int,_std::allocator<int>_>::end
                                  (&(this->super_SparseTextureClampLookupResidencyTestCase).
                                    super_SparseTexture2LookupTestCase.
                                    super_SparseTexture2CommitmentTestCase.
                                    super_SparseTextureCommitmentTestCase.mSupportedTargets);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &target);
      if (!bVar1) break;
      formIter._M_current =
           __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_30);
      local_58._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            (&(this->super_SparseTextureClampLookupResidencyTestCase).
                              super_SparseTexture2LookupTestCase.
                              super_SparseTexture2CommitmentTestCase.
                              super_SparseTextureCommitmentTestCase.mSupportedInternalFormats);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_50,
                 &local_58);
      while( true ) {
        format = (GLint *)std::vector<int,_std::allocator<int>_>::end
                                    (&(this->super_SparseTextureClampLookupResidencyTestCase).
                                      super_SparseTexture2LookupTestCase.
                                      super_SparseTexture2CommitmentTestCase.
                                      super_SparseTextureCommitmentTestCase.
                                      mSupportedInternalFormats);
        bVar1 = __gnu_cxx::operator!=
                          (&local_50,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &format);
        if (!bVar1) break;
        tokIter._M_current =
             (FunctionToken *)
             __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_50);
        uVar5 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                       super_SparseTexture2LookupTestCase.
                                       super_SparseTexture2CommitmentTestCase.
                                       super_SparseTextureCommitmentTestCase.super_TestCase.
                                       super_TestCase.super_TestNode + 0x30))
                          (this,*formIter._M_current,*(int *)&(tokIter._M_current)->name);
        if ((uVar5 & 1) != 0) {
          local_78._M_current =
               (FunctionToken *)
               std::
               vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
               ::begin(&(this->super_SparseTextureClampLookupResidencyTestCase).
                        super_SparseTexture2LookupTestCase.mFunctions);
          __gnu_cxx::
          __normal_iterator<gl4cts::SparseTexture2LookupTestCase::FunctionToken_const*,std::vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>>>
          ::__normal_iterator<gl4cts::SparseTexture2LookupTestCase::FunctionToken*>
                    ((__normal_iterator<gl4cts::SparseTexture2LookupTestCase::FunctionToken_const*,std::vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>>>
                      *)&local_70,&local_78);
          while( true ) {
            funcToken.allowedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)std::
                         vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
                         ::end(&(this->super_SparseTextureClampLookupResidencyTestCase).
                                super_SparseTexture2LookupTestCase.mFunctions);
            bVar1 = __gnu_cxx::operator!=
                              (&local_70,
                               (__normal_iterator<gl4cts::SparseTexture2LookupTestCase::FunctionToken_*,_std::vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>_>
                                *)&funcToken.allowedTargets._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
            if (!bVar1) break;
            pFVar6 = __gnu_cxx::
                     __normal_iterator<const_gl4cts::SparseTexture2LookupTestCase::FunctionToken_*,_std::vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>_>
                     ::operator*(&local_70);
            SparseTexture2LookupTestCase::FunctionToken::FunctionToken
                      ((FunctionToken *)local_f0,pFVar6);
            bVar2 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                           super_SparseTexture2LookupTestCase.
                                           super_SparseTexture2CommitmentTestCase.
                                           super_SparseTextureCommitmentTestCase.super_TestCase.
                                           super_TestCase.super_TestNode + 0x88))
                              (this,*formIter._M_current,*(undefined4 *)&(tokIter._M_current)->name,
                               (FunctionToken *)local_f0);
            if ((bVar2 & 1) == 0) {
              local_100 = 10;
            }
            else {
              local_101 = 0;
              lVar7 = std::__cxx11::string::find(local_f0,0x2a5f8c9);
              if (lVar7 != -1) {
                local_101 = 1;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&l,"",(allocator<char> *)((long)&maxLevels + 3));
              std::__cxx11::stringstream::str
                        ((string *)
                         &(this->super_SparseTextureClampLookupResidencyTestCase).
                          super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                          super_SparseTextureCommitmentTestCase.mLog);
              std::__cxx11::string::~string((string *)&l);
              std::allocator<char>::~allocator((allocator<char> *)((long)&maxLevels + 3));
              poVar8 = std::operator<<((ostream *)
                                       &(this->super_SparseTextureClampLookupResidencyTestCase).
                                        super_SparseTexture2LookupTestCase.
                                        super_SparseTexture2CommitmentTestCase.
                                        super_SparseTextureCommitmentTestCase.field_0x88,
                                       "Testing sparse texture lookup color functions for target: ")
              ;
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,*formIter._M_current);
              poVar8 = std::operator<<(poVar8,", format: ");
              poVar8 = (ostream *)
                       std::ostream::operator<<(poVar8,*(int *)&(tokIter._M_current)->name);
              std::operator<<(poVar8," - ");
              if ((local_101 & 1) == 0) {
                (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                       super_SparseTexture2LookupTestCase.
                                       super_SparseTexture2CommitmentTestCase.
                                       super_SparseTextureCommitmentTestCase.super_TestCase.
                                       super_TestCase.super_TestNode + 0x48))
                          (this,gl_00,*formIter._M_current,
                           *(undefined4 *)&(tokIter._M_current)->name,&iter,3);
              }
              else {
                (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                       super_SparseTexture2LookupTestCase.
                                       super_SparseTexture2CommitmentTestCase.
                                       super_SparseTextureCommitmentTestCase.super_TestCase.
                                       super_TestCase.super_TestNode + 0x40))
                          (this,gl_00,*formIter._M_current,
                           *(undefined4 *)&(tokIter._M_current)->name,&iter,3);
              }
              if (*(int *)&(tokIter._M_current)->name == 0x81a5) {
                (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                       super_SparseTexture2LookupTestCase.
                                       super_SparseTexture2CommitmentTestCase.
                                       super_SparseTextureCommitmentTestCase.super_TestCase.
                                       super_TestCase.super_TestNode + 0x90))
                          (this,gl_00,*formIter._M_current,&iter);
              }
              local_134 = 0;
              for (local_130 = 0;
                  local_130 <
                  (this->super_SparseTextureClampLookupResidencyTestCase).
                  super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                  super_SparseTextureCommitmentTestCase.mState.levels; local_130 = local_130 + 1) {
                if (((local_101 & 1) == 0) ||
                   (bVar2 = (**(code **)(*(long *)&(this->
                                                  super_SparseTextureClampLookupResidencyTestCase).
                                                  super_SparseTexture2LookupTestCase.
                                                  super_SparseTexture2CommitmentTestCase.
                                                  super_SparseTextureCommitmentTestCase.
                                                  super_TestCase.super_TestCase.super_TestNode +
                                        0x60))(this,gl_00,*formIter._M_current,
                                               *(undefined4 *)&(tokIter._M_current)->name,&iter,
                                               local_130), (bVar2 & 1) != 0)) {
                  (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                         super_SparseTexture2LookupTestCase.
                                         super_SparseTexture2CommitmentTestCase.
                                         super_SparseTextureCommitmentTestCase.super_TestCase.
                                         super_TestCase.super_TestNode + 0x50))
                            (this,gl_00,*formIter._M_current,
                             *(undefined4 *)&(tokIter._M_current)->name,&iter,local_130);
                  local_134 = local_130;
                }
              }
              for (local_130 = 0; local_130 <= local_134; local_130 = local_130 + 1) {
                local_322 = 0;
                if ((iter._M_current._7_1_ & 1) != 0) {
                  local_322 = (**(code **)(*(long *)&(this->
                                                  super_SparseTextureClampLookupResidencyTestCase).
                                                  super_SparseTexture2LookupTestCase.
                                                  super_SparseTexture2CommitmentTestCase.
                                                  super_SparseTextureCommitmentTestCase.
                                                  super_TestCase.super_TestCase.super_TestNode +
                                          0x98))(this,gl_00,*formIter._M_current,
                                                 *(undefined4 *)&(tokIter._M_current)->name,&iter,
                                                 local_130,local_f0);
                }
                iter._M_current._7_1_ = local_322 & 1;
                if (iter._M_current._7_1_ == 0) break;
              }
              gl4cts::Texture::Delete(gl_00,(GLuint *)&iter);
              if ((iter._M_current._7_1_ & 1) == 0) {
                this_01 = tcu::TestContext::getLog
                                    ((this->super_SparseTextureClampLookupResidencyTestCase).
                                     super_SparseTexture2LookupTestCase.
                                     super_SparseTexture2CommitmentTestCase.
                                     super_SparseTextureCommitmentTestCase.super_TestCase.
                                     super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_2b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
                std::__cxx11::stringstream::str();
                pMVar9 = tcu::MessageBuilder::operator<<(&local_2b8,&local_2d8);
                pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [5])0x2c0b9be);
                tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::string::~string((string *)&local_2d8);
                tcu::MessageBuilder::~MessageBuilder(&local_2b8);
                tcu::TestContext::setTestResult
                          ((this->super_SparseTextureClampLookupResidencyTestCase).
                           super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase
                           .super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
                this_local._4_4_ = STOP;
                local_100 = 1;
              }
              else {
                local_100 = 0;
              }
            }
            SparseTexture2LookupTestCase::FunctionToken::~FunctionToken((FunctionToken *)local_f0);
            if ((local_100 != 0) && (local_100 == 1)) {
              return this_local._4_4_;
            }
            __gnu_cxx::
            __normal_iterator<const_gl4cts::SparseTexture2LookupTestCase::FunctionToken_*,_std::vector<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>_>
            ::operator++(&local_70);
          }
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_50);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_30);
    }
    tcu::TestContext::setTestResult
              ((this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseTextureClampLookupColorTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture_clamp"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			for (std::vector<FunctionToken>::const_iterator tokIter = mFunctions.begin(); tokIter != mFunctions.end();
				 ++tokIter)
			{
				// Check if target is allowed for current lookup function
				FunctionToken funcToken = *tokIter;
				if (!funcAllowed(target, format, funcToken))
					continue;

				bool isSparse = false;
				if (funcToken.name.find("sparse", 0) != std::string::npos)
					isSparse = true;

				mLog.str("");
				mLog << "Testing sparse texture lookup color functions for target: " << target << ", format: " << format
					 << " - ";

				if (isSparse)
					sparseAllocateTexture(gl, target, format, texture, 3);
				else
					allocateTexture(gl, target, format, texture, 3);

				if (format == GL_DEPTH_COMPONENT16)
					setupDepthMode(gl, target, texture);

				int l;
				int maxLevels = 0;
				for (l = 0; l < mState.levels; ++l)
				{
					if (!isSparse || commitTexturePage(gl, target, format, texture, l))
					{
						writeDataToTexture(gl, target, format, texture, l);
						maxLevels = l;
					}
				}

				for (l = 0; l <= maxLevels; ++l)
				{
					result = result && verifyLookupTextureData(gl, target, format, texture, l, funcToken);

					if (!result)
						break;
				}

				Texture::Delete(gl, texture);

				if (!result)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}